

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O0

void __thiscall
spvtools::anon_unknown_0::ParsedInstruction::ParsedInstruction
          (ParsedInstruction *this,spv_parsed_instruction_t *instruction)

{
  pointer psVar1;
  unique_ptr<spv_parsed_operand_t[],_std::default_delete<spv_parsed_operand_t[]>_> local_20;
  spv_parsed_instruction_t *local_18;
  spv_parsed_instruction_t *instruction_local;
  ParsedInstruction *this_local;
  
  local_18 = instruction;
  instruction_local = &this->instruction_;
  std::unique_ptr<spv_parsed_operand_t[],std::default_delete<spv_parsed_operand_t[]>>::
  unique_ptr<std::default_delete<spv_parsed_operand_t[]>,void>
            ((unique_ptr<spv_parsed_operand_t[],std::default_delete<spv_parsed_operand_t[]>> *)
             &this->operands_);
  memcpy(this,local_18,0x28);
  std::make_unique<spv_parsed_operand_t[]>((size_t)&local_20);
  std::unique_ptr<spv_parsed_operand_t[],_std::default_delete<spv_parsed_operand_t[]>_>::operator=
            (&this->operands_,&local_20);
  std::unique_ptr<spv_parsed_operand_t[],_std::default_delete<spv_parsed_operand_t[]>_>::~unique_ptr
            (&local_20);
  psVar1 = std::unique_ptr<spv_parsed_operand_t[],_std::default_delete<spv_parsed_operand_t[]>_>::
           get(&this->operands_);
  memcpy(psVar1,local_18->operands,(ulong)local_18->num_operands << 4);
  psVar1 = std::unique_ptr<spv_parsed_operand_t[],_std::default_delete<spv_parsed_operand_t[]>_>::
           get(&this->operands_);
  (this->instruction_).operands = psVar1;
  return;
}

Assistant:

ParsedInstruction(const spv_parsed_instruction_t* instruction) {
    // Make a copy of the parsed instruction, including stable memory for its
    // operands.
    instruction_ = *instruction;
    operands_ =
        std::make_unique<spv_parsed_operand_t[]>(instruction->num_operands);
    memcpy(operands_.get(), instruction->operands,
           instruction->num_operands * sizeof(*instruction->operands));
    instruction_.operands = operands_.get();
  }